

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_view_field.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::cpp::anon_unknown_4::SingularStringView::GenerateOneofCopyConstruct
          (SingularStringView *this,Printer *p)

{
  undefined8 uVar1;
  char *pcVar2;
  
  if ((((this->super_FieldGeneratorBase).is_inlined_ == false) &&
      (((((this->super_FieldGeneratorBase).field_)->field_20).default_value_enum_)->all_names_ !=
       (string *)0x0)) && (this->opts_->experimental_use_micro_string != true)) {
    pcVar2 = "new (&$field$) decltype($field$){arena, from.$field$, $default_variable_field$};\n";
    uVar1 = 0x51;
  }
  else {
    pcVar2 = "new (&$field$) decltype($field$){arena, from.$field$};\n";
    uVar1 = 0x37;
  }
  io::Printer::Emit(p,0,0,uVar1,pcVar2);
  return;
}

Assistant:

void GenerateOneofCopyConstruct(io::Printer* p) const override {
    if (is_inlined() || EmptyDefault() || use_micro_string()) {
      p->Emit("new (&$field$) decltype($field$){arena, from.$field$};\n");
    } else {
      p->Emit(
          "new (&$field$) decltype($field$){arena, from.$field$,"
          " $default_variable_field$};\n");
    }
  }